

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

void Node_Release(thisnode p)

{
  nodecontext *p_00;
  long lVar1;
  nodeclass *Class_00;
  bool_t bVar2;
  nodeclass *Class;
  nodecontext *Context;
  thisnode p_local;
  
  if (p == (thisnode)0x0) {
    __assert_fail("p",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                  ,0x58d,"void Node_Release(thisnode)");
  }
  if (*(int *)((long)p + 4) == -0xf21f594) {
    if (p == (thisnode)0x0) {
      __assert_fail("(const void*)(p)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                    ,0x590,"void Node_Release(thisnode)");
    }
    p_00 = (nodecontext *)**(undefined8 **)((long)p + 8);
    lVar1 = *(long *)((long)p + 0x18) + -1;
    *(long *)((long)p + 0x18) = lVar1;
    if (lVar1 == 0) {
      Class_00 = (nodeclass *)(*(long *)((long)p + 8) + -0x48);
      Node_Notify((node *)p,0xb);
      if (*(long *)((long)p + 0x18) != 0) {
        __assert_fail("((node*)p)->RefCount == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                      ,0x596,"void Node_Release(thisnode)");
      }
      bVar2 = CallDelete(p_00,(node *)p,Class_00);
      if (bVar2 != 0) {
        EraseNode(p_00,(node *)p,Class_00);
      }
    }
    return;
  }
  __assert_fail("((node*)Node)->Magic==NODE_MAGIC",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                ,0x88,"void Node_ValidatePtr(anynode *)");
}

Assistant:

void Node_Release(thisnode p)
{
    nodecontext* Context;
    assert(p); // we may switch to virtual reference functions later
    Node_ValidatePtr(p);

    Context = Node_Context(p);
    if (--((node*)p)->RefCount == 0)
    {
        const nodeclass* Class = NodeGetClass(p);
        Node_Notify((node*)p,NODE_DELETING);

        assert(((node*)p)->RefCount == 0); // the RefCount may increase during Node_Notify but it shouldn't
        if (CallDelete(Context,p,Class))
            EraseNode(Context,p,Class);
    }
}